

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

void __thiscall
cfd::TransactionContext::SplitTxOut
          (TransactionContext *this,uint32_t index,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *locking_script_list)

{
  pointer pAVar1;
  uint32_t uVar2;
  char cVar3;
  int iVar4;
  CfdException *pCVar5;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  ulong uVar6;
  Amount *amount;
  pointer pAVar7;
  long lVar8;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range1;
  Amount total_amount;
  ByteData prev_tx;
  TxOutReference ref;
  string local_e0;
  uint32_t local_bc;
  Amount local_b8 [16];
  void *local_a8;
  undefined1 local_a0;
  undefined8 local_90;
  undefined1 local_88;
  undefined1 local_80 [80];
  
  if (SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
      ::kMinimumAmount == '\0') {
    iVar4 = __cxa_guard_acquire(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                                 ::kMinimumAmount);
    if (iVar4 != 0) {
      cfd::core::Amount::Amount
                ((Amount *)
                 SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                 ::kMinimumAmount,100);
      __cxa_guard_release(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                           ::kMinimumAmount);
    }
  }
  pAVar7 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)pAVar1 - (long)pAVar7 >> 4 !=
      ((long)(locking_script_list->
             super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(locking_script_list->
             super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"Unmatch list count.","");
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_80);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (pAVar7 == pAVar1) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"list is empty.","");
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_80);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_bc = index;
  cfd::core::Transaction::GetTxOut((uint)local_80);
  local_b8[0] = (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                        ::kMinimumAmount[0];
  local_b8[1] = (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                        ::kMinimumAmount[1];
  local_b8[2] = (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                        ::kMinimumAmount[2];
  local_b8[3] = (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                        ::kMinimumAmount[3];
  local_b8[4] = (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                        ::kMinimumAmount[4];
  local_b8[5] = (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                        ::kMinimumAmount[5];
  local_b8[6] = (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                        ::kMinimumAmount[6];
  local_b8[7] = (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                        ::kMinimumAmount[7];
  local_b8[8] = (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                        ::kMinimumAmount[8];
  local_b8[9] = (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                        ::kMinimumAmount[9];
  local_b8[10] = (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                         ::kMinimumAmount[10];
  local_b8[0xb] =
       (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
               ::kMinimumAmount[0xb];
  local_b8[0xc] =
       (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
               ::kMinimumAmount[0xc];
  local_b8[0xd] =
       (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
               ::kMinimumAmount[0xd];
  local_b8[0xe] =
       (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
               ::kMinimumAmount[0xe];
  local_b8[0xf] =
       (Amount)SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
               ::kMinimumAmount[0xf];
  pAVar7 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pAVar7 != pAVar1) {
    do {
      cfd::core::Amount::operator+=(local_b8,pAVar7);
      pAVar7 = pAVar7 + 0x10;
    } while (pAVar7 != pAVar1);
  }
  local_e0._M_dataplus._M_p = (pointer)local_80._8_8_;
  local_e0._M_string_length._0_1_ = local_80[0x10];
  cVar3 = cfd::core::operator<((Amount *)&local_e0,local_b8);
  uVar2 = local_bc;
  if (cVar3 == '\0') {
    local_e0._M_dataplus._M_p = (pointer)local_80._8_8_;
    local_e0._M_string_length._0_1_ = local_80[0x10];
    local_a8 = (void *)cfd::core::operator-
                                 (local_b8,(Amount *)
                                           SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                                           ::kMinimumAmount);
    local_a0 = extraout_DL;
    local_90 = cfd::core::operator-((Amount *)&local_e0,(Amount *)&local_a8);
    local_88 = extraout_DL_00;
    (**(code **)(*(long *)this + 0x40))(&local_a8,this);
    cfd::core::Transaction::SetTxOutValue((uint)this,(Amount *)(ulong)uVar2);
    if ((amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      lVar8 = 0;
      uVar6 = 0;
      do {
        cVar3 = cfd::core::Script::IsEmpty();
        if (cVar3 != '\0') {
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"Locking script is empty.","");
          core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_e0);
          __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
        cfd::core::Transaction::AddTxOut
                  ((Amount *)this,
                   (Script *)
                   ((amount_list->
                    super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
                    _M_impl.super__Vector_impl_data._M_start + lVar8));
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 0x10;
      } while (uVar6 < (ulong)((long)(amount_list->
                                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(amount_list->
                                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    if (local_a8 != (void *)0x0) {
      operator_delete(local_a8);
    }
    local_80._0_8_ = &PTR__AbstractTxOutReference_002b1160;
    core::Script::~Script((Script *)(local_80 + 0x18));
    return;
  }
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"The Amount is too large.","")
  ;
  core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_e0);
  __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContext::SplitTxOut(
    uint32_t index, const std::vector<Amount>& amount_list,
    const std::vector<Script>& locking_script_list) {
  static const Amount kMinimumAmount(int64_t{100});

  if (amount_list.size() != locking_script_list.size()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch list count.");
  } else if (amount_list.empty()) {
    throw CfdException(CfdError::kCfdIllegalArgumentError, "list is empty.");
  }

  auto ref = GetTxOut(index);
  Amount total_amount = kMinimumAmount;
  for (const auto& amount : amount_list) total_amount += amount;

  if (ref.GetValue() < total_amount) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "The Amount is too large.");
  }
  Amount update_amount = ref.GetValue() - (total_amount - kMinimumAmount);

  ByteData prev_tx = GetData();
  try {
    SetTxOutValue(index, update_amount);
    for (size_t txout_idx = 0; txout_idx < amount_list.size(); ++txout_idx) {
      if (locking_script_list[txout_idx].IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Locking script is empty.");
      }
      AddTxOut(amount_list[txout_idx], locking_script_list[txout_idx]);
    }
  } catch (const CfdException& except) {
    SetFromHex(prev_tx.GetHex());  // rollback
    throw except;
  }
}